

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddReturning(Parse *pParse,ExprList *pList)

{
  Returning *xCleanup;
  code *pcVar1;
  Parse *in_RSI;
  Parse *in_RDI;
  sqlite3 *db;
  Hash *pHash;
  Returning *pRet;
  sqlite3 *psVar2;
  sqlite3 *db_00;
  
  db_00 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  psVar2 = in_RDI->db;
  if (in_RDI->pNewTrigger != (Trigger *)0x0) {
    sqlite3ErrorMsg(in_RDI,"cannot use RETURNING in a trigger");
  }
  in_RDI->bReturning = '\x01';
  xCleanup = (Returning *)sqlite3DbMallocZero(db_00,(u64)psVar2);
  if (xCleanup == (Returning *)0x0) {
    sqlite3ExprListDelete(db_00,(ExprList *)psVar2);
  }
  else {
    (in_RDI->u1).pReturning = xCleanup;
    xCleanup->pParse = in_RDI;
    xCleanup->pReturnEL = (ExprList *)in_RSI;
    sqlite3ParserAddCleanup(in_RSI,(_func_void_sqlite3_ptr_void_ptr *)xCleanup,db_00);
    if (psVar2->mallocFailed == '\0') {
      sqlite3_snprintf(0x28,xCleanup->zName,"sqlite_returning_%p",in_RDI);
      (xCleanup->retTrig).zName = xCleanup->zName;
      (xCleanup->retTrig).op = 0x97;
      (xCleanup->retTrig).tr_tm = '\x02';
      (xCleanup->retTrig).bReturning = '\x01';
      (xCleanup->retTrig).pSchema = psVar2->aDb[1].pSchema;
      (xCleanup->retTrig).pTabSchema = psVar2->aDb[1].pSchema;
      (xCleanup->retTrig).step_list = &xCleanup->retTStep;
      (xCleanup->retTStep).op = 0x97;
      (xCleanup->retTStep).pTrig = &xCleanup->retTrig;
      (xCleanup->retTStep).pExprList = (ExprList *)in_RSI;
      psVar2 = (sqlite3 *)&(psVar2->aDb[1].pSchema)->trigHash;
      pcVar1 = (code *)sqlite3HashInsert((Hash *)pList,(char *)pRet,pHash);
      if ((Trigger *)pcVar1 == &xCleanup->retTrig) {
        sqlite3OomFault(psVar2);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddReturning(Parse *pParse, ExprList *pList){
  Returning *pRet;
  Hash *pHash;
  sqlite3 *db = pParse->db;
  if( pParse->pNewTrigger ){
    sqlite3ErrorMsg(pParse, "cannot use RETURNING in a trigger");
  }else{
    assert( pParse->bReturning==0 || pParse->ifNotExists );
  }
  pParse->bReturning = 1;
  pRet = sqlite3DbMallocZero(db, sizeof(*pRet));
  if( pRet==0 ){
    sqlite3ExprListDelete(db, pList);
    return;
  }
  pParse->u1.pReturning = pRet;
  pRet->pParse = pParse;
  pRet->pReturnEL = pList;
  sqlite3ParserAddCleanup(pParse, sqlite3DeleteReturning, pRet);
  testcase( pParse->earlyCleanup );
  if( db->mallocFailed ) return;
  sqlite3_snprintf(sizeof(pRet->zName), pRet->zName,
                   "sqlite_returning_%p", pParse);
  pRet->retTrig.zName = pRet->zName;
  pRet->retTrig.op = TK_RETURNING;
  pRet->retTrig.tr_tm = TRIGGER_AFTER;
  pRet->retTrig.bReturning = 1;
  pRet->retTrig.pSchema = db->aDb[1].pSchema;
  pRet->retTrig.pTabSchema = db->aDb[1].pSchema;
  pRet->retTrig.step_list = &pRet->retTStep;
  pRet->retTStep.op = TK_RETURNING;
  pRet->retTStep.pTrig = &pRet->retTrig;
  pRet->retTStep.pExprList = pList;
  pHash = &(db->aDb[1].pSchema->trigHash);
  assert( sqlite3HashFind(pHash, pRet->zName)==0
          || pParse->nErr  || pParse->ifNotExists );
  if( sqlite3HashInsert(pHash, pRet->zName, &pRet->retTrig)
          ==&pRet->retTrig ){
    sqlite3OomFault(db);
  }
}